

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

void pong_frame_written(cio_websocket *websocket,void *handler_context,cio_error err)

{
  cio_http_client *pcVar1;
  char *reason;
  
  if (err == CIO_SUCCESS) {
    pcVar1 = (websocket->ws_private).http_client;
    err = cio_buffered_stream_read_at_least
                    (&pcVar1->buffered_stream,&pcVar1->rb,1,get_header,websocket);
    if (err == CIO_SUCCESS) {
      return;
    }
    reason = "could not restart receiving after pong frame written";
  }
  else {
    reason = "pong frame not written correctly";
  }
  handle_error(websocket,err,CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR,reason);
  return;
}

Assistant:

static void pong_frame_written(struct cio_websocket *websocket, void *handler_context, enum cio_error err)
{
	(void)handler_context;

	if (cio_unlikely(err != CIO_SUCCESS)) {
		handle_error(websocket, err, CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, "pong frame not written correctly");
		return;
	}

	struct cio_http_client *client = websocket->ws_private.http_client;
	err = cio_buffered_stream_read_at_least(&client->buffered_stream, &client->rb, 1, get_header, websocket);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		handle_error(websocket, err, CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, "could not restart receiving after pong frame written");
	}
}